

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::ModfCaseInstance::compare
          (ModfCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  pointer pSVar4;
  uint uVar5;
  int iVar6;
  deUint32 dVar7;
  ostream *poVar8;
  uint uVar9;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  ulong uVar10;
  ulong uVar11;
  float input;
  float output;
  deUint32 u32;
  float fVar12;
  HexFloat local_74;
  HexFloat local_70;
  HexFloat local_6c;
  undefined1 local_68 [16];
  deUint32 u32_1;
  undefined1 local_48 [16];
  
  pSVar4 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = *(uint *)((long)&(pSVar4->varType).m_data + 4);
  uVar5 = glu::getDataTypeScalarSize((pSVar4->varType).m_data.basic.type);
  iVar3 = *(int *)(&DAT_009f499c + (ulong)uVar2 * 4);
  uVar11 = 0;
  uVar10 = 0;
  if (0 < (int)uVar5) {
    uVar10 = (ulong)uVar5;
  }
  do {
    if (uVar10 == uVar11) {
LAB_007a3b76:
      return (long)(int)uVar5 <= (long)uVar11;
    }
    input = *(float *)((long)*inputs + uVar11 * 4);
    fVar12 = *(float *)((long)*outputs + uVar11 * 4);
    fVar1 = *(float *)((long)outputs[1] + uVar11 * 4);
    local_48 = ZEXT416((uint)(float)(int)input);
    output = input - (float)(int)input;
    local_68 = ZEXT416((uint)output);
    iVar6 = 0;
    _u32_1 = ZEXT416((uint)input);
    if (uVar2 != 2) {
      iVar6 = numBitsLostInOp(input,output);
      input = (float)u32_1;
    }
    iVar6 = iVar3 - iVar6;
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    fVar12 = fVar12 + fVar1;
    if (uVar2 == 2) {
      dVar7 = (int)input - (int)fVar12;
      if ((uint)input < (uint)fVar12) {
        dVar7 = -((int)input - (int)fVar12);
      }
    }
    else {
      dVar7 = getUlpDiffIgnoreZeroSign(fVar12,input);
    }
    uVar9 = ~(-1 << (0x17U - (char)iVar6 & 0x1f));
    if (uVar9 < dVar7) {
      poVar8 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                               "Expected [");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)uVar11);
      poVar8 = std::operator<<(poVar8,"] = (");
      local_6c.value = (float)local_68._0_4_;
      poVar8 = anon_unknown_0::operator<<(poVar8,&local_6c);
      poVar8 = std::operator<<(poVar8,") + (");
      local_70.value = (float)local_48._0_4_;
      poVar8 = anon_unknown_0::operator<<(poVar8,&local_70);
      poVar8 = std::operator<<(poVar8,") = ");
      local_74.value = (float)u32_1;
      poVar8 = anon_unknown_0::operator<<(poVar8,&local_74);
      poVar8 = std::operator<<(poVar8," with ULP threshold ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar9;
      poVar8 = tcu::Format::operator<<(poVar8,hex);
      poVar8 = std::operator<<(poVar8,", got ULP diff ");
      hex_00.value._4_4_ = 0;
      hex_00.value._0_4_ = dVar7;
      tcu::Format::operator<<(poVar8,hex_00);
      goto LAB_007a3b76;
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		out1		= ((const float*)outputs[1])[compNdx];

			const float		refOut1		= float(int(in0));
			const float		refOut0		= in0 - refOut1;

			const int		bitsLost	= precision != glu::PRECISION_HIGHP ? numBitsLostInOp(in0, refOut0) : 0;
			const deUint32	maxUlpDiff	= getMaxUlpDiffFromBits(de::max(mantissaBits - bitsLost, 0));

			const float		resSum		= out0 + out1;

			const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(resSum, in0) : getUlpDiffIgnoreZeroSign(resSum, in0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = (" << HexFloat(refOut0) << ") + (" << HexFloat(refOut1) << ") = " << HexFloat(in0) << " with ULP threshold "
							<< tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}